

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlelement.c
# Opt level: O3

size_t EBML_FillBufferID(uint8_t *Buffer,size_t BufSize,fourcc_t Id)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  size_t sVar5;
  undefined1 auVar6 [16];
  int iVar7;
  int iVar10;
  int iVar11;
  undefined1 auVar8 [16];
  int iVar12;
  undefined1 auVar9 [16];
  undefined1 auVar13 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar14 [16];
  
  sVar5 = 1;
  if ((0xff < Id) && (sVar5 = 2, 0xffff < Id)) {
    sVar5 = 4 - (ulong)(Id < 0x1000000);
  }
  if (BufSize < sVar5) {
    sVar5 = 0;
  }
  else {
    lVar1 = sVar5 - 1;
    auVar8._8_4_ = (int)lVar1;
    auVar8._0_8_ = lVar1;
    auVar8._12_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar8 = auVar8 ^ _DAT_0012f3e0;
    iVar7 = auVar8._0_4_;
    iVar10 = auVar8._4_4_;
    iVar11 = auVar8._8_4_;
    iVar12 = auVar8._12_4_;
    auVar13._0_4_ = -(uint)(iVar10 == -0x80000000);
    auVar13._4_4_ = -(uint)(iVar10 == -0x80000000);
    auVar13._8_4_ = -(uint)(iVar12 == -0x80000000);
    auVar13._12_4_ = -(uint)(iVar12 == -0x80000000);
    auVar14._4_4_ = -(uint)(iVar7 < -0x80000000);
    auVar14._0_4_ = -(uint)(iVar7 < -0x80000000);
    auVar14._8_4_ = -(uint)(iVar11 < -0x7fffffff);
    auVar14._12_4_ = -(uint)(iVar11 < -0x7fffffff);
    auVar13 = auVar13 & auVar14;
    auVar14 = pshuflw(in_XMM4,auVar13,0xe8);
    auVar2._8_4_ = 0xffffffff;
    auVar2._0_8_ = 0xffffffffffffffff;
    auVar2._12_4_ = 0xffffffff;
    auVar14 = packssdw(auVar14 ^ auVar2,auVar14 ^ auVar2);
    if ((auVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      Buffer[sVar5 - 1] = (uint8_t)Id;
    }
    auVar14 = packssdw(auVar13,auVar13);
    auVar3._8_4_ = 0xffffffff;
    auVar3._0_8_ = 0xffffffffffffffff;
    auVar3._12_4_ = 0xffffffff;
    auVar14 = packssdw(auVar14 ^ auVar3,auVar14 ^ auVar3);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14._0_4_ >> 8 & 1) != 0) {
      Buffer[sVar5 - 2] = (uint8_t)(Id >> 8);
    }
    auVar6._0_4_ = -(uint)(DAT_00132750._4_4_ == iVar10);
    auVar6._4_4_ = -(uint)(DAT_00132750._4_4_ == iVar10);
    auVar6._8_4_ = -(uint)(DAT_00132750._12_4_ == iVar12);
    auVar6._12_4_ = -(uint)(DAT_00132750._12_4_ == iVar12);
    auVar4._4_4_ = -(uint)(iVar7 < (int)DAT_00132750);
    auVar4._0_4_ = -(uint)(iVar7 < (int)DAT_00132750);
    auVar4._8_4_ = -(uint)(iVar11 < DAT_00132750._8_4_);
    auVar4._12_4_ = -(uint)(iVar11 < DAT_00132750._8_4_);
    auVar6 = auVar6 & auVar4;
    auVar14 = packssdw(_DAT_00132750,auVar6);
    auVar9._8_4_ = 0xffffffff;
    auVar9._0_8_ = 0xffffffffffffffff;
    auVar9._12_4_ = 0xffffffff;
    auVar14 = packssdw(auVar14 ^ auVar9,auVar14 ^ auVar9);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14._0_4_ >> 0x10 & 1) != 0) {
      Buffer[sVar5 - 3] = (uint8_t)(Id >> 0x10);
    }
    auVar14 = pshufhw(auVar6,auVar6,0x84);
    auVar14 = packssdw(auVar14 ^ auVar9,auVar14 ^ auVar9);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14._0_4_ >> 0x18 & 1) != 0) {
      Buffer[sVar5 - 4] = (uint8_t)(Id >> 0x18);
      return sVar5;
    }
  }
  return sVar5;
}

Assistant:

size_t EBML_FillBufferID(uint8_t *Buffer, size_t BufSize, fourcc_t Id)
{
    size_t i,FinalHeadSize = GetIdLength(Id);
    if (BufSize < FinalHeadSize)
        return 0;
    for (i=0;i<FinalHeadSize;++i)
        Buffer[FinalHeadSize-i-1] = (uint8_t)(Id >> (i<<3));
    return FinalHeadSize;
}